

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

HelicsMessage helicsEndpointCreateMessage(HelicsEndpoint endpoint,HelicsError *err)

{
  EndpointObject *pEVar1;
  HelicsEndpoint in_RSI;
  EndpointObject *endObj;
  HelicsError *in_stack_ffffffffffffffe0;
  Message *local_8;
  
  pEVar1 = anon_unknown.dwarf_784a3::verifyEndpoint(in_RSI,in_stack_ffffffffffffffe0);
  if (pEVar1 == (EndpointObject *)0x0) {
    local_8 = (Message *)0x0;
  }
  else if (pEVar1->fed == (FedObject *)0x0) {
    local_8 = (Message *)0x0;
  }
  else {
    local_8 = helics::MessageHolder::newMessage((MessageHolder *)err);
  }
  return local_8;
}

Assistant:

HelicsMessage helicsEndpointCreateMessage(HelicsEndpoint endpoint, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return nullptr;
    }
    if (endObj->fed == nullptr) {
        return nullptr;
    }
    return endObj->fed->messages.newMessage();
}